

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

void indexesFromRange<QList<QModelIndex>>(QItemSelectionRange *range,QList<QModelIndex> *result)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  QAbstractItemModel *pQVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined8 local_78;
  undefined1 *puStack_70;
  QAbstractItemModel *local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  QAbstractItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QItemSelectionRange::isValid(range);
  if (bVar1) {
    pQVar5 = QPersistentModelIndex::model(&range->tl);
    if (pQVar5 != (QAbstractItemModel *)0x0) {
      local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&range->tl);
      uVar2 = QPersistentModelIndex::row(&range->br);
      iVar3 = QPersistentModelIndex::column(&range->br);
      if ((int)(uint)local_58 <= (int)uVar2) {
        uVar6 = (uint)local_58;
        do {
          local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          if (local_48 == (QAbstractItemModel *)0x0) {
            local_78 = (undefined1 *)0xffffffffffffffff;
            puStack_70 = (undefined1 *)0x0;
            local_68 = (QAbstractItemModel *)0x0;
          }
          else if ((uint)local_58 == uVar6) {
            local_68 = local_48;
            local_78 = local_58;
            puStack_70 = puStack_50;
          }
          else {
            (*(local_48->super_QObject)._vptr_QObject[0xe])
                      (&local_78,local_48,(ulong)uVar6,(ulong)local_58._4_4_,&local_58);
          }
          uVar7 = local_58._4_4_;
          if ((int)local_58._4_4_ <= iVar3) {
            do {
              local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              local_98 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
              if (local_68 == (QAbstractItemModel *)0x0) {
                local_98 = (undefined1 *)0xffffffffffffffff;
                puStack_90 = (undefined1 *)0x0;
                local_88.ptr = (QAbstractItemModel *)0x0;
              }
              else if (((uint)local_78 == uVar6) && (uVar7 == local_78._4_4_)) {
                local_88.ptr = local_68;
                local_98 = local_78;
                puStack_90 = puStack_70;
              }
              else {
                (*(local_68->super_QObject)._vptr_QObject[0xe])
                          ((QModelIndex *)&local_98,local_68,(ulong)uVar6,(ulong)uVar7,&local_78);
              }
              pQVar5 = QPersistentModelIndex::model(&range->tl);
              uVar4 = (*(pQVar5->super_QObject)._vptr_QObject[0x27])
                                (pQVar5,(QModelIndex *)&local_98);
              if ((~uVar4 & 0x21) == 0) {
                QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                          ((QMovableArrayOps<QModelIndex> *)result,(result->d).size,
                           (QModelIndex *)&local_98);
                QList<QModelIndex>::end(result);
              }
              uVar7 = uVar7 + 1;
            } while (iVar3 + 1U != uVar7);
          }
          bVar1 = uVar6 != uVar2;
          uVar6 = uVar6 + 1;
        } while (bVar1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void indexesFromRange(const QItemSelectionRange &range, ModelIndexContainer &result)
{
    if (range.isValid() && range.model()) {
        const QModelIndex topLeft = range.topLeft();
        const int bottom = range.bottom();
        const int right = range.right();
        for (int row = topLeft.row(); row <= bottom; ++row) {
            const QModelIndex columnLeader = topLeft.sibling(row, topLeft.column());
            for (int column = topLeft.column(); column <= right; ++column) {
                QModelIndex index = columnLeader.sibling(row, column);
                if (isSelectableAndEnabled(range.model()->flags(index)))
                    result.push_back(index);
            }
        }
    }
}